

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O2

string * __thiscall
flatbuffers::BaseGenerator::GetNameSpace_abi_cxx11_
          (string *__return_storage_ptr__,BaseGenerator *this,Definition *def)

{
  Namespace *pNVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer pbVar3;
  allocator<char> local_21;
  
  pNVar1 = def->defined_namespace;
  iVar2 = (*this->_vptr_BaseGenerator[3])(this);
  if ((Namespace *)CONCAT44(extraout_var,iVar2) == pNVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&this->qualifying_start_);
    pbVar3 = (pNVar1->components).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (pbVar3 != (pNVar1->components).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      pbVar3 = pbVar3 + 1;
      if (pbVar3 != (pNVar1->components).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BaseGenerator::GetNameSpace(const Definition &def) const {
  const Namespace *ns = def.defined_namespace;
  if (CurrentNameSpace() == ns) return "";
  std::string qualified_name = qualifying_start_;
  for (auto it = ns->components.begin(); it != ns->components.end(); ++it) {
    qualified_name += *it;
    if ((it + 1) != ns->components.end()) {
      qualified_name += qualifying_separator_;
    }
  }

  return qualified_name;
}